

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O2

void Gia_ManStaticFanoutStop(Gia_Man_t *p)

{
  Vec_IntFreeP(&p->vFanoutNums);
  Vec_IntFreeP(&p->vFanout);
  return;
}

Assistant:

void Gia_ManStaticFanoutStop( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vFanoutNums );
    Vec_IntFreeP( &p->vFanout );
}